

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cptrapcc_16(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  cs_m68k *pcVar4;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar5;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = read_imm_16(info);
    uVar3 = read_imm_16(info);
    pcVar4 = build_init_op(info,0xee,1,2);
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + (uVar2 & 0x2f);
    pcVar4->operands[0].type = M68K_OP_IMM;
    pcVar4->operands[0].address_mode = M68K_AM_IMMEDIATE;
    aVar5.reg_pair.reg_1 = 0;
    aVar5.reg = uVar3;
    pcVar4->operands[0].field_0 = aVar5;
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cptrapcc_16(m68k_info *info)
{
	uint extension1, extension2;
	cs_m68k_op* op0;
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);
	extension2 = read_imm_16(info);

	ext = build_init_op(info, M68K_INS_FTRAPF, 1, 2);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);

	op0 = &ext->operands[0];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = extension2;
}